

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worm.c
# Opt level: O1

void place_worm_tail_randomly(monst *worm,xchar x,xchar y)

{
  byte bVar1;
  level *lev;
  wseg *pwVar2;
  wseg *pwVar3;
  byte bVar4;
  boolean bVar5;
  uint uVar6;
  uint uVar7;
  char cVar8;
  char *s;
  wseg *__ptr;
  char cVar9;
  byte bVar10;
  byte local_54;
  
  bVar1 = worm->wormno;
  if (bVar1 == 0) {
    s = "place_worm_tail_randomly: worm->wormno was 0";
  }
  else {
    lev = worm->dlevel;
    pwVar2 = lev->wtails[bVar1];
    s = "place_worm_tail_randomly: wormno is set without a tail!";
    if ((pwVar2 != (wseg *)0x0) && (lev->wheads[bVar1] != (wseg *)0x0)) {
      lev->wheads[bVar1] = pwVar2;
      __ptr = pwVar2->nseg;
      pwVar2->nseg = (wseg *)0x0;
      pwVar2->wx = x;
      pwVar2->wy = y;
      do {
        if (__ptr == (wseg *)0x0) {
          return;
        }
        local_54 = y - 0x15;
        bVar10 = 0;
        do {
          uVar6 = mt_random();
          if (x < '\x02') {
            uVar6 = uVar6 & 1;
          }
          else if (x < 'P') {
            uVar6 = ~((uVar6 / 3) * 3) + uVar6;
          }
          else {
            uVar6 = -(uVar6 & 1);
          }
          if (uVar6 == 0) {
            bVar4 = (y < '\x02') * '\x02' - 1;
            if (0xec < local_54) {
              uVar7 = mt_random();
              bVar4 = -((uVar7 & 1) == 0) | 1;
            }
          }
          else {
            uVar7 = mt_random();
            bVar4 = (byte)uVar7;
            if (y < '\x02') {
              bVar4 = bVar4 & 1;
            }
            else if (y < '\x15') {
              bVar4 = ~((char)(uVar7 / 3) * '\x03') + bVar4;
            }
            else {
              bVar4 = -(bVar4 & 1);
            }
          }
          cVar8 = (char)uVar6 + x;
          cVar9 = bVar4 + y;
          bVar5 = goodpos(lev,(int)cVar8,(int)cVar9,worm,0);
          if (bVar5 != '\0') goto LAB_0028a7ff;
          bVar10 = bVar10 + 1;
        } while (bVar10 != 0x33);
        bVar10 = 0x33;
LAB_0028a7ff:
        if (bVar10 < 0x32) {
          worm->dlevel->monsters[cVar8][cVar9] = worm;
          __ptr->wx = cVar8;
          __ptr->wy = cVar9;
          lev->wtails[bVar1] = __ptr;
          pwVar3 = __ptr->nseg;
          __ptr->nseg = pwVar2;
          pwVar2 = lev->wtails[bVar1];
          newsym((int)cVar8,(int)cVar9);
          __ptr = pwVar3;
          x = cVar8;
          y = cVar9;
        }
        else {
          do {
            pwVar3 = __ptr->nseg;
            if ((long)__ptr->wx != 0) {
              lev->monsters[__ptr->wx][__ptr->wy] = (monst *)0x0;
            }
            free(__ptr);
            __ptr = pwVar3;
          } while (pwVar3 != (wseg *)0x0);
          __ptr = (wseg *)0x0;
        }
      } while( true );
    }
  }
  warning(s);
  return;
}

Assistant:

void place_worm_tail_randomly(struct monst *worm, xchar x, xchar y)
{
    int wnum = worm->wormno;
    struct level *lev = worm->dlevel;
    struct wseg *curr = lev->wtails[wnum];
    struct wseg *new_tail;
    xchar ox = x, oy = y;

    if (!wnum) {
	warning("place_worm_tail_randomly: worm->wormno was 0");
	return;
    }

    if (wnum && (!lev->wtails[wnum] || !lev->wheads[wnum]) ) {
	warning("place_worm_tail_randomly: wormno is set without a tail!");
	return;
    }

    lev->wheads[wnum] = new_tail = curr;
    curr = curr->nseg;
    new_tail->nseg = NULL;
    new_tail->wx = x;
    new_tail->wy = y;

    while (curr)  {
	xchar nx, ny;
	char tryct = 0;

	/* pick a random direction from x, y and search for goodpos() */

	do {
	    random_dir(ox, oy, &nx, &ny);
	} while (!goodpos(lev, nx, ny, worm, 0) && (tryct++ < 50));

	if (tryct < 50)  {
	    place_worm_seg(worm, nx, ny);
	    curr->wx = ox = nx;
	    curr->wy = oy = ny;
	    lev->wtails[wnum] = curr;
	    curr = curr->nseg;
	    lev->wtails[wnum]->nseg = new_tail;
	    new_tail = lev->wtails[wnum];
	    newsym(nx, ny);
	} else {			/* Oops.  Truncate because there was */
	    toss_wsegs(lev, curr, FALSE);    /* no place for the rest of it */
	    curr = NULL;
	}
    }
}